

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::BaseBuilder::removeNodes(BaseBuilder *this,BaseNode *first,BaseNode *last)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar4;
  uint32_t didRemoveSection;
  BaseNode *node;
  BaseNode *next;
  BaseNode *prev;
  char *in_stack_00000350;
  int in_stack_0000035c;
  char *in_stack_00000360;
  long *local_98;
  BaseNode *in_stack_ffffffffffffff70;
  BaseBuilder *in_stack_ffffffffffffff78;
  
  if (in_RSI == in_RDX) {
    removeNode(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  else {
    bVar3 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                      (*(NodeFlags *)((long)in_RSI + 0x11),kIsActive);
    if (bVar3) {
      lVar1 = *in_RSI;
      plVar2 = (long *)in_RDX[1];
      if (*(long **)(in_RDI + 0x1a0) == in_RSI) {
        *(long **)(in_RDI + 0x1a0) = plVar2;
      }
      else {
        *(long **)(lVar1 + 8) = plVar2;
      }
      if (*(long **)(in_RDI + 0x1a8) == in_RDX) {
        *(long *)(in_RDI + 0x1a8) = lVar1;
      }
      else {
        *plVar2 = lVar1;
      }
      bVar3 = false;
      local_98 = in_RSI;
      do {
        plVar2 = (long *)local_98[1];
        if (plVar2 == (long *)0x0) {
          DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
        }
        *local_98 = 0;
        local_98[1] = 0;
        *(byte *)((long)local_98 + 0x11) = *(byte *)((long)local_98 + 0x11) & 0x7f;
        bVar3 = (bool)((char)local_98[2] == '\x02' | bVar3);
        if (*(long **)(in_RDI + 0x198) == local_98) {
          *(long *)(in_RDI + 0x198) = lVar1;
        }
        bVar4 = local_98 != in_RDX;
        local_98 = plVar2;
      } while (bVar4);
      if (bVar3) {
        *(undefined1 *)(in_RDI + 0x1b1) = 1;
      }
    }
  }
  return;
}

Assistant:

void BaseBuilder::removeNodes(BaseNode* first, BaseNode* last) noexcept {
  if (first == last) {
    removeNode(first);
    return;
  }

  if (!first->isActive())
    return;

  BaseNode* prev = first->prev();
  BaseNode* next = last->next();

  if (_nodeList._first == first)
    _nodeList._first = next;
  else
    prev->_next = next;

  if (_nodeList._last == last)
    _nodeList._last  = prev;
  else
    next->_prev = prev;

  BaseNode* node = first;
  uint32_t didRemoveSection = false;

  for (;;) {
    next = node->next();
    ASMJIT_ASSERT(next != nullptr);

    node->_prev = nullptr;
    node->_next = nullptr;
    node->clearFlags(NodeFlags::kIsActive);
    didRemoveSection |= uint32_t(node->isSection());

    if (_cursor == node)
      _cursor = prev;

    if (node == last)
      break;
    node = next;
  }

  if (didRemoveSection)
    _dirtySectionLinks = true;
}